

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter_test.c
# Opt level: O0

void test_counter_non_zero(testing t)

{
  uint32_t uVar1;
  int iVar2;
  nsync_counter c_00;
  char *pcVar3;
  nsync_time nVar4;
  nsync_time nVar5;
  nsync_time b;
  __syscall_slong_t local_90;
  nsync_counter local_78;
  __syscall_slong_t local_70;
  nsync_counter c;
  nsync_time abs_deadline;
  nsync_time waited;
  nsync_time start;
  testing t_local;
  
  c_00 = nsync::nsync_counter_new(1);
  uVar1 = nsync::nsync_counter_value(c_00);
  if (uVar1 != 1) {
    pcVar3 = smprintf("counter is not 1 (test)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x33,pcVar3);
  }
  uVar1 = nsync::nsync_counter_wait((nsync *)c_00,(nsync_counter)0x0,(nsync_time)ZEXT816(0));
  if (uVar1 != 1) {
    pcVar3 = smprintf("counter is not 1 (poll)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x36,pcVar3);
  }
  nVar4 = nsync::nsync_time_now();
  nVar5 = nsync::nsync_time_now();
  b = nsync::nsync_time_ms(1000);
  local_90 = b.tv_nsec;
  nVar5 = nsync::nsync_time_add(nVar5,b);
  local_78 = (nsync_counter)nVar5.tv_sec;
  local_70 = nVar5.tv_nsec;
  nVar5.tv_nsec = local_90;
  nVar5.tv_sec = local_70;
  uVar1 = nsync::nsync_counter_wait((nsync *)c_00,local_78,nVar5);
  if (uVar1 != 1) {
    pcVar3 = smprintf("counter is not 1 (1s wait)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x3b,pcVar3);
  }
  nVar5 = nsync::nsync_time_now();
  nVar4 = nsync::nsync_time_sub(nVar5,nVar4);
  nVar5 = nsync::nsync_time_ms(900);
  iVar2 = nsync::nsync_time_cmp(nVar4,nVar5);
  if (iVar2 < 0) {
    pcVar3 = nsync_time_str(nVar4,2);
    pcVar3 = smprintf("timed wait on non-zero counter returned too quickly (1s wait took %s)",pcVar3
                     );
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x40,pcVar3);
  }
  nVar5 = nsync::nsync_time_ms(2000);
  iVar2 = nsync::nsync_time_cmp(nVar4,nVar5);
  if (0 < iVar2) {
    pcVar3 = nsync_time_str(nVar4,2);
    pcVar3 = smprintf("timed wait on non-zero counter returned too slowly (1s wait took %s)",pcVar3)
    ;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x44,pcVar3);
  }
  uVar1 = nsync::nsync_counter_add(c_00,-1);
  if (uVar1 != 0) {
    pcVar3 = smprintf("zero counter note is not 0 (add)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x48,pcVar3);
  }
  uVar1 = nsync::nsync_counter_value(c_00);
  if (uVar1 != 0) {
    pcVar3 = smprintf("zero counter note is not 0 (test)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x4c,pcVar3);
  }
  uVar1 = nsync::nsync_counter_wait((nsync *)c_00,(nsync_counter)0x0,(nsync_time)ZEXT816(0));
  if (uVar1 != 0) {
    pcVar3 = smprintf("zero counter note is not 0 (poll)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x4f,pcVar3);
  }
  nVar4.tv_nsec = 0x7fffffffffffffff;
  nVar4.tv_sec = 999999999;
  uVar1 = nsync::nsync_counter_wait((nsync *)c_00,(nsync_counter)0x7fffffffffffffff,nVar4);
  if (uVar1 != 0) {
    pcVar3 = smprintf("zero counter note is not 0 (infinite wait)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x52,pcVar3);
  }
  nsync::nsync_counter_free(c_00);
  return;
}

Assistant:

static void test_counter_non_zero (testing t) {
	nsync_time start;
	nsync_time waited;
	nsync_time abs_deadline;
	nsync_counter c = nsync_counter_new (1);
	if (nsync_counter_value (c) != 1) {
		TEST_ERROR (t, ("counter is not 1 (test)"));
	}
	if (nsync_counter_wait (c, nsync_time_zero) != 1) {
		TEST_ERROR (t, ("counter is not 1 (poll)"));
	}
	start = nsync_time_now ();
	abs_deadline = nsync_time_add (nsync_time_now (), nsync_time_ms (1000));
	if (nsync_counter_wait (c, abs_deadline) != 1) {
		TEST_ERROR (t, ("counter is not 1 (1s wait)"));
	}
	waited = nsync_time_sub (nsync_time_now (), start);
	if (nsync_time_cmp (waited, nsync_time_ms (900)) < 0) {
		TEST_ERROR (t, ("timed wait on non-zero counter returned too quickly (1s wait took %s)",
			   nsync_time_str (waited, 2)));
	}
	if (nsync_time_cmp (waited, nsync_time_ms (2000)) > 0) {
		TEST_ERROR (t, ("timed wait on non-zero counter returned too slowly (1s wait took %s)",
			   nsync_time_str (waited, 2)));
	}

	if (nsync_counter_add (c, -1) != 0) {
		TEST_ERROR (t, ("zero counter note is not 0 (add)"));
	}

	if (nsync_counter_value (c) != 0) {
		TEST_ERROR (t, ("zero counter note is not 0 (test)"));
	}
	if (nsync_counter_wait (c, nsync_time_zero) != 0) {
		TEST_ERROR (t, ("zero counter note is not 0 (poll)"));
	}
	if (nsync_counter_wait (c, nsync_time_no_deadline) != 0) {
		TEST_ERROR (t, ("zero counter note is not 0 (infinite wait)"));
	}
	nsync_counter_free (c);
}